

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_move_semantics.cpp
# Opt level: O1

void __thiscall L18_1::Useless::Useless(Useless *this,int k,char ch)

{
  int iVar1;
  int iVar2;
  long *plVar3;
  char *pcVar4;
  long lVar5;
  
  this->n = k;
  count = count + 1;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"int and char constructor called, number of instance: ",0x35);
  plVar3 = (long *)std::ostream::operator<<(&std::cout,count);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  iVar1 = this->n;
  iVar2 = -1;
  if (-1 < iVar1) {
    iVar2 = iVar1;
  }
  pcVar4 = (char *)operator_new__((long)iVar2);
  this->pc = pcVar4;
  if (0 < iVar1) {
    lVar5 = 0;
    do {
      this->pc[lVar5] = ch;
      lVar5 = lVar5 + 1;
    } while (lVar5 < this->n);
  }
  showObject(this);
  return;
}

Assistant:

Useless::Useless(int k, char ch): n(k) {
        count++;
        cout << "int and char constructor called, number of instance: " << count << endl;

        //  allocate array of char, and fill with ch
        pc = new char[n];
        for(int i = 0; i < n; i++) {
            pc[i] = ch;
        }
        showObject();
    }